

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpExtensions.cpp
# Opt level: O1

void __thiscall
GrpTokenStreamFilter::ReportParserError(GrpTokenStreamFilter *this,ParserException *ex)

{
  int iVar1;
  code *pcVar2;
  pointer pcVar3;
  string *psVar4;
  int iVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  long *local_a0;
  long local_98;
  long local_90 [2];
  long *local_80;
  long local_78;
  long local_70 [2];
  string local_60;
  string local_40;
  
  iVar5 = (**(code **)(*(long *)&ex->super_ANTLRException + 0x30))(ex);
  pcVar2 = *(code **)(*(long *)&ex->super_ANTLRException + 0x28);
  local_c8._0_4_ = iVar5;
  if (this->m_nLastLineMarker < iVar5) {
    (*pcVar2)(&local_60,ex);
    iVar1 = this->m_nLineOffset;
    pcVar3 = (this->m_staFile)._M_dataplus._M_p;
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar3,pcVar3 + (this->m_staFile)._M_string_length);
    local_c8._4_4_ = iVar1 + iVar5;
    local_c0._M_p = (pointer)&local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_a0,local_98 + (long)local_a0);
    AddGlobalError(true,0x67,&local_60,(GrpLineAndFile *)local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_p != &local_b0) {
      operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    psVar4 = &local_60;
  }
  else {
    (*pcVar2)(&local_40,ex);
    iVar1 = this->m_nPrevLineOffset;
    pcVar3 = (this->m_staPrevFile)._M_dataplus._M_p;
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar3,pcVar3 + (this->m_staPrevFile)._M_string_length);
    local_c8._4_4_ = iVar1 + iVar5;
    local_c0._M_p = (pointer)&local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_80,local_78 + (long)local_80);
    AddGlobalError(true,0x66,&local_40,(GrpLineAndFile *)local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_p != &local_b0) {
      operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
    }
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    psVar4 = &local_40;
  }
  paVar6 = &psVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar6->_M_allocated_capacity)[-2] != paVar6) {
    operator_delete((undefined1 *)(&paVar6->_M_allocated_capacity)[-2],
                    paVar6->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GrpTokenStreamFilter::ReportParserError(const ParserException & ex)
{
	int nLinePre = ex.getLine();
	if (nLinePre <= m_nLastLineMarker)
		//	Problematic token was before the last line marker in the pre-processed file.
		AddGlobalError(true, 102, ex.getErrorMessage(),
			GrpLineAndFile(nLinePre, nLinePre + m_nPrevLineOffset, m_staPrevFile));
	else
		AddGlobalError(true, 103, ex.getErrorMessage(),
			GrpLineAndFile(nLinePre, nLinePre + m_nLineOffset, m_staFile));
}